

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O3

ZyanStatus ZydisFormatterTokenNext(ZydisFormatterTokenConst **token)

{
  ZydisFormatterTokenConst *pZVar1;
  ZyanStatus ZVar2;
  
  ZVar2 = 0x80100004;
  if ((token != (ZydisFormatterTokenConst **)0x0) &&
     (pZVar1 = *token, pZVar1 != (ZydisFormatterTokenConst *)0x0)) {
    if ((ulong)pZVar1->next == 0) {
      return 0x80100008;
    }
    *token = (ZydisFormatterTokenConst *)(&pZVar1[1].type + pZVar1->next);
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterTokenNext(ZydisFormatterTokenConst** token)
{
    if (!token || !*token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    const ZyanU8 next = (*token)->next;
    if (!next)
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }
    *token = (ZydisFormatterTokenConst*)((ZyanU8*)*token + sizeof(ZydisFormatterToken) + next);

    return ZYAN_STATUS_SUCCESS;
}